

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::copy_cut_border_3d
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int front,int behind,
               Option *opt)

{
  Layer *pLVar1;
  undefined4 in_register_0000000c;
  ParamDict pd;
  
  if (((right + left <= src->w) && (bottom + top <= src->h)) && (behind + front <= src->d)) {
    pLVar1 = create_layer(7);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,left);
    ParamDict::set(&pd,1,top);
    ParamDict::set(&pd,0xd,front);
    ParamDict::set(&pd,2,0);
    ParamDict::set(&pd,3,src->w - (right + left));
    ParamDict::set(&pd,4,src->h - (bottom + top));
    ParamDict::set(&pd,0xe,src->d - (behind + front));
    ParamDict::set(&pd,5,-0xe9);
    (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
    (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
    (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    (*pLVar1->_vptr_Layer[1])(pLVar1);
    ParamDict::~ParamDict(&pd);
    return;
  }
  fprintf(_stderr,
          "copy_cut_border_3d parameter error, top: %d, bottom: %d, left: %d, right: %d, front: %d, behind: %d, src.w: %d, src.h: %d, src.d: %d"
          ,(ulong)(uint)top,CONCAT44(in_register_0000000c,bottom),(ulong)(uint)left,right,
          (ulong)(uint)front,(ulong)(uint)behind,(ulong)(uint)src->w,(ulong)(uint)src->h,
          (ulong)(uint)src->d);
  fputc(10,_stderr);
  return;
}

Assistant:

void copy_cut_border_3d(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int front, int behind, const Option& opt)
{
    if (left + right > src.w || top + bottom > src.h || front + behind > src.d)
    {
        NCNN_LOGE("copy_cut_border_3d parameter error, top: %d, bottom: %d, left: %d, right: %d, front: %d, behind: %d, src.w: %d, src.h: %d, src.d: %d", top, bottom, left, right, front, behind, src.w, src.h, src.d);
        return;
    }
    Layer* crop = create_layer(LayerType::Crop);

    ParamDict pd;
    pd.set(0, left);
    pd.set(1, top);
    pd.set(13, front);
    pd.set(2, 0);
    pd.set(3, src.w - left - right);
    pd.set(4, src.h - top - bottom);
    pd.set(14, src.d - front - behind);
    pd.set(5, -233);

    crop->load_param(pd);

    crop->create_pipeline(opt);

    crop->forward(src, dst, opt);

    crop->destroy_pipeline(opt);

    delete crop;
}